

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int save_session_ticket_cb(ptls_save_ticket_t *_self,ptls_t *tls,ptls_iovec_t src)

{
  int iVar1;
  void *p;
  void **ppvVar2;
  size_t in_RCX;
  void *in_RDX;
  ptls_t *in_RSI;
  ptls_iovec_t pVar3;
  quicly_conn_t *conn;
  quicly_transport_parameters_t *in_stack_00000068;
  undefined8 local_30;
  undefined8 local_28;
  
  free(session_info.tls_ticket.base);
  p = malloc(in_RCX);
  pVar3 = ptls_iovec_init(p,in_RCX);
  local_30 = pVar3.base;
  session_info.tls_ticket.base = local_30;
  local_28 = pVar3.len;
  session_info.tls_ticket.len = local_28;
  memcpy(local_30,in_RDX,in_RCX);
  ppvVar2 = ptls_get_data_ptr(in_RSI);
  quicly_get_remote_transport_parameters((quicly_conn_t *)*ppvVar2);
  iVar1 = save_session(in_stack_00000068);
  return iVar1;
}

Assistant:

int save_session_ticket_cb(ptls_save_ticket_t *_self, ptls_t *tls, ptls_iovec_t src)
{
    free(session_info.tls_ticket.base);
    session_info.tls_ticket = ptls_iovec_init(malloc(src.len), src.len);
    memcpy(session_info.tls_ticket.base, src.base, src.len);

    quicly_conn_t *conn = *ptls_get_data_ptr(tls);
    return save_session(quicly_get_remote_transport_parameters(conn));
}